

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v10::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,void *value)

{
  appender aVar1;
  undefined1 local_48 [8];
  format_specs<char> local_40;
  appender local_30;
  void *local_28;
  void *value_local;
  default_arg_formatter<char> *this_local;
  undefined1 *local_10;
  
  local_30.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_28 = value;
  value_local = this;
  format_specs<char>::format_specs(&local_40);
  local_10 = local_48;
  aVar1 = write<char,_fmt::v10::appender,_void,_0>(local_30,value,&local_40,(locale_ref)0x0);
  return (iterator)
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }